

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O3

void __thiscall CECorrections::UpdateNutationCache(CECorrections *this,double *mjd)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar1;
  iterator __first;
  iterator __last;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  invalid_value *this_01;
  CECorrections *pCVar7;
  ulong __n;
  double dVar8;
  value_type vVar9;
  double mjd_upper;
  double mjd_lower;
  string msg;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((*mjd == this->cache_nut_mjd_) && (!NAN(*mjd) && !NAN(this->cache_nut_mjd_))) {
    return;
  }
  LoadNutation(this);
  this_00 = &this->nutation_mjd_;
  __first = std::vector<int,_std::allocator<int>_>::begin(this_00);
  __last = std::vector<int,_std::allocator<int>_>::end(this_00);
  local_130._M_dataplus._M_p =
       (pointer)std::
                lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,double>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __first._M_current,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __last._M_current,mjd);
  local_150._M_dataplus._M_p = (pointer)std::vector<int,_std::allocator<int>_>::begin(this_00);
  uVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&local_130
                     ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      &local_150);
  uVar1 = (int)uVar2 - 1;
  if (-1 < (int)uVar1) {
    __n = (ulong)uVar1;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(this_00);
    if (__n < sVar3 - 1) {
      if (this->interp_ == false) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->nutation_dut1_,__n)
        ;
        this->cache_nut_dut1_ = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->nutation_xp_,__n);
        this->cache_nut_xp_ = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->nutation_yp_,__n);
        this->cache_nut_yp_ = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->nutation_deps_,__n)
        ;
        this->cache_nut_deps_ = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->nutation_dpsi_,__n)
        ;
        vVar9 = *pvVar5;
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,__n);
        local_130._M_dataplus._M_p = (pointer)(double)*pvVar4;
        uVar2 = uVar2 & 0xffffffff;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,uVar2);
        local_150._M_dataplus._M_p = (pointer)(double)*pvVar4;
        pCVar7 = (CECorrections *)&this->nutation_dut1_;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,__n);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,uVar2);
        dVar8 = InterpValue(pCVar7,mjd,(double *)&local_130,(double *)&local_150,pvVar5,pvVar6);
        this->cache_nut_dut1_ = dVar8;
        pCVar7 = (CECorrections *)&this->nutation_xp_;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,__n);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,uVar2);
        dVar8 = InterpValue(pCVar7,mjd,(double *)&local_130,(double *)&local_150,pvVar5,pvVar6);
        this->cache_nut_xp_ = dVar8;
        pCVar7 = (CECorrections *)&this->nutation_yp_;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,__n);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,uVar2);
        dVar8 = InterpValue(pCVar7,mjd,(double *)&local_130,(double *)&local_150,pvVar5,pvVar6);
        this->cache_nut_yp_ = dVar8;
        pCVar7 = (CECorrections *)&this->nutation_deps_;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,__n);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,uVar2);
        dVar8 = InterpValue(pCVar7,mjd,(double *)&local_130,(double *)&local_150,pvVar5,pvVar6);
        this->cache_nut_deps_ = dVar8;
        pCVar7 = (CECorrections *)&this->nutation_dpsi_;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,__n);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)pCVar7,uVar2);
        vVar9 = InterpValue(pCVar7,mjd,(double *)&local_130,(double *)&local_150,pvVar5,pvVar6);
      }
      this->cache_nut_dpsi_ = vVar9;
      this->cache_nut_mjd_ = *mjd;
      return;
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::front(this_00);
  std::__cxx11::to_string(&local_130,*pvVar4);
  pvVar4 = std::vector<int,_std::allocator<int>_>::back(this_00);
  std::__cxx11::to_string(&local_150,*pvVar4);
  std::__cxx11::to_string(&local_d0,*mjd);
  std::operator+(&local_b0,"Invalid mjd: ",&local_d0);
  std::operator+(&local_90,&local_b0,". Accepted ");
  std::operator+(&local_70,&local_90,"range is ");
  std::operator+(&local_110,&local_70,&local_130);
  std::operator+(&local_f0,&local_110," - ");
  std::operator+(&local_50,&local_f0,&local_150);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  this_01 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"UpdateNutationCache",(allocator *)&local_110);
  CEException::invalid_value::invalid_value(this_01,&local_f0,&local_50);
  __cxa_throw(this_01,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

void CECorrections::UpdateNutationCache(const double& mjd) const
{
    // Check if the nutation actually needs to be updated
    if (mjd != cache_nut_mjd_) {
        // Make sure nutation corrections are loaded
        LoadNutation();

        // Compute the closest index associated with the MJD
        int indx = (std::lower_bound(nutation_mjd_.begin(),nutation_mjd_.end(), mjd) 
                    - nutation_mjd_.begin() ) - 1;

        // Make sure the MJD date is covered by stored correction values
        if ((indx < 0) || (indx >= nutation_mjd_.size()-1)) {
            // TODO: Make this a warning message
            std::string min_mjd(std::to_string(nutation_mjd_.front()));
            std::string max_mjd(std::to_string(nutation_mjd_.back()));
            std::string msg = "Invalid mjd: " + std::to_string(mjd) + ". Accepted " +
                            "range is " + min_mjd + " - " + max_mjd;
            throw CEException::invalid_value(__func__, msg);
        } 

        // Get the uninterpolated value
        else if (!interp_) {
            cache_nut_dut1_ = nutation_dut1_[indx];
            cache_nut_xp_   = nutation_xp_[indx];
            cache_nut_yp_   = nutation_yp_[indx];
            cache_nut_deps_ = nutation_deps_[indx];
            cache_nut_dpsi_ = nutation_dpsi_[indx];
        } 
        
        // Otherwise interpolate between closest two values (a bit slower)
        else {
            double mjd_lower( nutation_mjd_[indx] );
            double mjd_upper( nutation_mjd_[indx+1] );
            
            cache_nut_dut1_ = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_dut1_[indx], 
                                          nutation_dut1_[indx+1]);
            cache_nut_xp_   = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_xp_[indx], 
                                          nutation_xp_[indx+1]);
            cache_nut_yp_   = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_yp_[indx], 
                                          nutation_yp_[indx+1]);
            cache_nut_deps_ = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_deps_[indx], 
                                          nutation_deps_[indx+1]);
            cache_nut_dpsi_ = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_dpsi_[indx], 
                                          nutation_dpsi_[indx+1]);
        }

        cache_nut_mjd_  = mjd;
    }

    return;
}